

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thrdd.c
# Opt level: O3

void Curl_async_thrdd_shutdown(Curl_easy *data)

{
  curl_socket_t s;
  async_thrdd_addr_ctx *paVar1;
  curl_trc_feat *pcVar2;
  uint uVar3;
  
  paVar1 = (data->state).async.thrdd.addr;
  if (((paVar1 != (async_thrdd_addr_ctx *)0x0) && (paVar1->thread_hnd != (pthread_t *)0x0)) &&
     (((data->set).field_0x89d & 2) == 0)) {
    asyn_thrdd_await(data,paVar1,(Curl_dns_entry **)0x0);
    return;
  }
  paVar1 = (data->state).async.thrdd.addr;
  if (paVar1 != (async_thrdd_addr_ctx *)0x0) {
    s = paVar1->sock_pair[0];
    pthread_mutex_lock((pthread_mutex_t *)&paVar1->mutx);
    (data->state).async.thrdd.addr = (async_thrdd_addr_ctx *)0x0;
    uVar3 = paVar1->ref_count - 1;
    paVar1->ref_count = uVar3;
    if (((((data->set).field_0x89f & 0x40) != 0) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_dns.log_level)) {
      Curl_trc_dns(data,"resolve, destroy async data, shared ref=%d",(ulong)uVar3);
      uVar3 = paVar1->ref_count;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&paVar1->mutx);
    if (uVar3 == 0) {
      if (paVar1->thread_hnd != (pthread_t *)0x0) {
        Curl_thread_join(&paVar1->thread_hnd);
      }
      addr_ctx_destroy(paVar1);
    }
    else {
      Curl_thread_destroy(&paVar1->thread_hnd);
    }
    Curl_multi_will_close(data,s);
    close(s);
    return;
  }
  return;
}

Assistant:

void Curl_async_thrdd_shutdown(struct Curl_easy *data)
{
  struct async_thrdd_ctx *thrdd = &data->state.async.thrdd;

  /* If we are still resolving, we must wait for the threads to fully clean up,
     unfortunately. Otherwise, we can simply cancel to clean up any resolver
     data. */
  if(thrdd->addr && (thrdd->addr->thread_hnd != curl_thread_t_null) &&
     !data->set.quick_exit)
    (void)asyn_thrdd_await(data, thrdd->addr, NULL);
  else
    async_thrdd_destroy(data);
}